

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scala_file.hpp
# Opt level: O0

void __thiscall scala::scale::scale(scale *this)

{
  degree *this_00;
  scale *this_local;
  
  std::vector<scala::degree,_std::allocator<scala::degree>_>::vector(&this->degrees);
  this_00 = (degree *)operator_new(8);
  degree::degree(this_00,0.0);
  std::vector<scala::degree,_std::allocator<scala::degree>_>::push_back(&this->degrees,this_00);
  return;
}

Assistant:

scale () {
            // The first degree is a scala file is always implicit. Make it explicit.
            degrees.push_back( *(new degree(0.0)));
        }